

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3NodeWrite(Fts3Table *p,SegmentNode *pTree,int iHeight,sqlite3_int64 iLeaf,
                 sqlite3_int64 iFree,sqlite3_int64 *piLast,char **paRoot,int *pnRoot)

{
  int iVar1;
  Fts3Table *in_RCX;
  undefined4 in_EDX;
  Fts3Table *in_RSI;
  long in_R8;
  long *in_R9;
  char **unaff_retaddr;
  long *in_stack_00000008;
  int *in_stack_00000010;
  int nWrite;
  int nStart_1;
  sqlite3_int64 iNextLeaf;
  sqlite3_int64 iNextFree;
  SegmentNode *pIter;
  int nStart;
  int rc;
  sqlite3_int64 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar2;
  char *local_40;
  uint in_stack_ffffffffffffffc8;
  int iVar3;
  Fts3Table *pFVar4;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar3 = 0;
  if ((in_RSI->base).pModule == (sqlite3_module *)0x0) {
    iVar1 = fts3TreeFinishNode((SegmentNode *)
                               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
    *in_R9 = in_R8 + -1;
    *in_stack_00000010 = *(int *)&in_RSI->azColumn - iVar1;
    *in_stack_00000008 = (long)(in_RSI->abNotindexed + iVar1);
  }
  else {
    pFVar4 = in_RCX;
    for (local_40 = (in_RSI->base).zErrMsg; uVar2 = local_40 != (char *)0x0 && iVar3 == 0,
        local_40 != (char *)0x0 && iVar3 == 0; local_40 = *(char **)(local_40 + 8)) {
      iVar3 = fts3TreeFinishNode((SegmentNode *)CONCAT17(uVar2,in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      iVar3 = fts3WriteSegment(in_RCX,CONCAT44(iVar3,*(int *)(local_40 + 0x38) - iVar3),
                               (char *)CONCAT17(uVar2,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff9c);
      in_RCX = (Fts3Table *)((long)in_RCX->aStmt + (long)(*(int *)(local_40 + 0x18) + 1) + -0x68);
    }
    if (iVar3 == 0) {
      iVar3 = fts3NodeWrite(in_RSI,(SegmentNode *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)pFVar4 >> 0x20),in_R8,(sqlite3_int64)in_R9,
                            (sqlite3_int64 *)(ulong)in_stack_ffffffffffffffc8,unaff_retaddr,
                            (int *)in_stack_00000008);
    }
  }
  return iVar3;
}

Assistant:

static int fts3NodeWrite(
  Fts3Table *p,                   /* Virtual table handle */
  SegmentNode *pTree,             /* SegmentNode handle */
  int iHeight,                    /* Height of this node in tree */
  sqlite3_int64 iLeaf,            /* Block id of first leaf node */
  sqlite3_int64 iFree,            /* Block id of next free slot in %_segments */
  sqlite3_int64 *piLast,          /* OUT: Block id of last entry written */
  char **paRoot,                  /* OUT: Data for root node */
  int *pnRoot                     /* OUT: Size of root node in bytes */
){
  int rc = SQLITE_OK;

  if( !pTree->pParent ){
    /* Root node of the tree. */
    int nStart = fts3TreeFinishNode(pTree, iHeight, iLeaf);
    *piLast = iFree-1;
    *pnRoot = pTree->nData - nStart;
    *paRoot = &pTree->aData[nStart];
  }else{
    SegmentNode *pIter;
    sqlite3_int64 iNextFree = iFree;
    sqlite3_int64 iNextLeaf = iLeaf;
    for(pIter=pTree->pLeftmost; pIter && rc==SQLITE_OK; pIter=pIter->pRight){
      int nStart = fts3TreeFinishNode(pIter, iHeight, iNextLeaf);
      int nWrite = pIter->nData - nStart;
  
      rc = fts3WriteSegment(p, iNextFree, &pIter->aData[nStart], nWrite);
      iNextFree++;
      iNextLeaf += (pIter->nEntry+1);
    }
    if( rc==SQLITE_OK ){
      assert( iNextLeaf==iFree );
      rc = fts3NodeWrite(
          p, pTree->pParent, iHeight+1, iFree, iNextFree, piLast, paRoot, pnRoot
      );
    }
  }

  return rc;
}